

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void onreqvarls(uint8_t *data,uint32_t sz,i2cp_state *st,void *user)

{
  uint8_t *buf;
  byte bVar1;
  size_t __n;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  size_t sVar7;
  void *__dest;
  uint8_t *sig;
  size_t __n_00;
  
  uVar6 = *(ushort *)data << 8 | *(ushort *)data >> 8;
  if (uVar6 != st->sid) {
    printf("i2cp session id missmatch %d != %d\n",(ulong)uVar6);
  }
  bVar1 = data[2];
  *(uint16_t *)((long)user + 0x743610) = st->sid << 8 | st->sid >> 8;
  if (*(short *)((long)user + 0x411998) == 0) {
    puVar2 = *(undefined8 **)((long)user + 0x4119a8);
    *(undefined4 *)((long)user + 0x743622) = *(undefined4 *)(puVar2 + 2);
    uVar3 = puVar2[1];
    *(undefined8 *)((long)user + 0x743612) = *puVar2;
    *(undefined8 *)((long)user + 0x74361a) = uVar3;
  }
  else {
    *(undefined8 *)((long)user + 0x743612) = 0;
    *(undefined8 *)((long)user + 0x74361a) = 0;
    *(undefined4 *)((long)user + 0x743622) = 0;
  }
  memcpy((void *)((long)user + 0x743626),(void *)((long)user + 0x4119c0),0x100);
  buf = (uint8_t *)((long)user + 0x743726);
  __n = *(size_t *)((long)user + 0x411990);
  memcpy(buf,(void *)((long)user + 0x411790),__n);
  __dest = (void *)((long)user + __n + 0x743726);
  memcpy(__dest,(void *)((long)user + 0x411ac0),0x100);
  puVar2 = *(undefined8 **)((long)user + 0x4119a8);
  uVar3 = puVar2[1];
  uVar4 = puVar2[2];
  uVar5 = puVar2[3];
  *(undefined8 *)((long)user + __n + 0x743826) = *puVar2;
  *(undefined8 *)((long)user + __n + 0x74382e) = uVar3;
  *(undefined8 *)((long)user + __n + 0x743836) = uVar4;
  *(undefined8 *)((long)user + __n + 0x74383e) = uVar5;
  *(byte *)((long)user + __n + 0x743846) = bVar1;
  __n_00 = (ulong)bVar1 * 0x2c;
  memcpy((void *)((long)user + __n + 0x743847),data + 3,__n_00);
  sig = (uint8_t *)((long)__dest + __n_00 + 0x121);
  i2p_dest_sign((i2p_privkeybuf *)((long)user + 0x4114b6),buf,(long)sig - (long)buf,sig);
  sVar7 = i2p_dest_sigsize((i2p_privkeybuf *)((long)user + 0x4114b6));
  i2cp_queue_send(st,'\x04',(uint8_t *)((long)user + 0x743610),
                  ((int)sig + (int)sVar7) - (int)(uint8_t *)((long)user + 0x743610));
  printf("created LS with %d leases\n",(ulong)bVar1);
  return;
}

Assistant:

void onreqvarls(uint8_t * data, uint32_t sz, struct i2cp_state * st, void * user)
{
  struct trans2p * t = user;
  struct i2p_privkeybuf * priv = &t->privkey;
  struct i2p_dest * dest = &t->ourdest;

  uint16_t sid = bufbe16toh(data);
  if(sid != st->sid)
  {
    printf("i2cp session id missmatch %d != %d\n", sid, st->sid);
  }
  
  uint8_t numls = data[2];
  
  uint8_t * buf = t->buf;
  uint8_t * begin = buf;
  // sid
  htobe16buf(buf, st->sid);
  buf += 2;
  // 20 bytes revoke
  if(t->ourdest.sigtype)
    memset(buf, 0, 20);
  else
    memcpy(buf, t->ourdest.sigkey, 20);
  
  buf += 20;
  // elg privkey
  memcpy(buf, t->lskey.priv, 256);
  buf += 256;
  // begin LS
  uint8_t * ls_ptr = buf;
  // destination
  memcpy(ls_ptr, dest->buf, dest->sz);
  buf += dest->sz;
  // LS pubkey
  memcpy(buf, t->lskey.pub, 256);
  buf += 256;
  // revoke key
  memcpy(buf, dest->sigkey, 32);
  buf += 32;
  // num leases
  *buf = numls;
  buf ++;
  // leases
  memcpy(buf, data + 3, (numls * 44));
  buf += numls * 44;
  // signature
  i2p_dest_sign(priv, ls_ptr, buf - ls_ptr, buf);
  buf += i2p_dest_sigsize(priv);
  // end
  i2cp_queue_send(st, CREATELS, begin, buf - begin);
  printf("created LS with %d leases\n", numls);
}